

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_context_init_sparc64(TCGContext_conflict8 *s)

{
  int iVar1;
  TCGOpDef *pTVar2;
  GHashTable *hash_table;
  GHashTable *pGVar3;
  int *piVar4;
  jit_code_entry *pjVar5;
  TCGTemp *t;
  TCGv_ptr pTVar6;
  int r;
  GHashTable *helper_table;
  TCGTemp *ts;
  int *sorted_args;
  TCGArgConstraint *args_ct;
  TCGOpDef *def;
  int i;
  int n;
  int total_args;
  int op;
  TCGContext_conflict8 *s_local;
  
  memset(s,0,0xa7a0);
  s->nb_globals = 0;
  pTVar2 = (TCGOpDef *)g_malloc0(0x1720);
  s->tcg_op_defs = pTVar2;
  memcpy(s->tcg_op_defs,tcg_op_defs_org,0x1720);
  i = 0;
  for (n = 0; n < 0xb9; n = n + 1) {
    i = (uint)s->tcg_op_defs[n].nb_iargs + (uint)s->tcg_op_defs[n].nb_oargs + i;
  }
  sorted_args = (int *)g_malloc0((long)i << 3);
  ts = (TCGTemp *)g_malloc0((long)i << 2);
  for (n = 0; n < 0xb9; n = n + 1) {
    pTVar2 = s->tcg_op_defs;
    pTVar2[n].args_ct = (TCGArgConstraint *)sorted_args;
    pTVar2[n].sorted_args = (int *)ts;
    iVar1 = (uint)pTVar2[n].nb_iargs + (uint)pTVar2[n].nb_oargs;
    ts = (TCGTemp *)(&ts->field_0x0 + (long)iVar1 * 4);
    sorted_args = sorted_args + (long)iVar1 * 2;
  }
  hash_table = g_hash_table_new((GHashFunc)0x0,(GEqualFunc)0x0);
  s->helper_table = hash_table;
  pGVar3 = g_hash_table_new_full
                     ((GHashFunc)0x0,(GEqualFunc)0x0,(GDestroyNotify)0x0,uc_free_inline_hook_info);
  s->custom_helper_infos = pGVar3;
  for (def._0_4_ = 0; (uint)def < 0x17b; def._0_4_ = (uint)def + 1) {
    g_hash_table_insert(hash_table,all_helpers[(int)(uint)def].func,all_helpers + (int)(uint)def);
  }
  tcg_target_init(s);
  process_op_defs(s);
  def._4_4_ = 0;
  while ((def._4_4_ < 0x1f &&
         ((s->tcg_target_call_clobber_regs >>
           ((byte)tcg_target_reg_alloc_order[(int)def._4_4_] & 0x1f) & 1) == 0))) {
    def._4_4_ = def._4_4_ + 1;
  }
  piVar4 = (int *)g_malloc(0x7c);
  s->indirect_reg_alloc_order = piVar4;
  for (def._0_4_ = 0; (int)(uint)def < 0x1f; def._0_4_ = (uint)def + 1) {
    s->indirect_reg_alloc_order[(int)(uint)def] =
         tcg_target_reg_alloc_order[(int)(0x1e - (uint)def)];
  }
  for (; (uint)def < 0x1f; def._0_4_ = (uint)def + 1) {
    s->indirect_reg_alloc_order[(int)(uint)def] = tcg_target_reg_alloc_order[(int)(uint)def];
  }
  pjVar5 = (jit_code_entry *)g_malloc(0x20);
  s->one_entry = pjVar5;
  s->one_entry->symfile_addr = (void *)0x0;
  t = tcg_global_reg_new_internal(s,TCG_TYPE_I64,TCG_AREG0,"env");
  pTVar6 = temp_tcgv_ptr(s,t);
  s->cpu_env = pTVar6;
  return;
}

Assistant:

void tcg_context_init(TCGContext *s)
{
    int op, total_args, n, i;
    TCGOpDef *def;
    TCGArgConstraint *args_ct;
    int *sorted_args;
    TCGTemp *ts;
    GHashTable *helper_table;

    memset(s, 0, sizeof(*s));
    s->nb_globals = 0;

    // copy original tcg_op_defs_org for private usage
    s->tcg_op_defs = g_malloc0(sizeof(tcg_op_defs_org));
    memcpy(s->tcg_op_defs, tcg_op_defs_org, sizeof(tcg_op_defs_org));

    /* Count total number of arguments and allocate the corresponding
       space */
    total_args = 0;
    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        n = def->nb_iargs + def->nb_oargs;
        total_args += n;
    }

    args_ct = g_malloc0(sizeof(TCGArgConstraint) * total_args);
    sorted_args = g_malloc0(sizeof(int) * total_args);

    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        def->args_ct = args_ct;
        def->sorted_args = sorted_args;
        n = def->nb_iargs + def->nb_oargs;
        sorted_args += n;
        args_ct += n;
    }

    /* Register helpers.  */
    /* Use g_direct_hash/equal for direct pointer comparisons on func.  */
    helper_table = g_hash_table_new(NULL, NULL);
    s->helper_table = helper_table;

    // Unicorn: Store our custom inline hooks infomation
    s->custom_helper_infos = g_hash_table_new_full(NULL, NULL, NULL, uc_free_inline_hook_info);

    for (i = 0; i < ARRAY_SIZE(all_helpers); ++i) {
        g_hash_table_insert(helper_table, (gpointer)all_helpers[i].func,
                            (gpointer)&all_helpers[i]);
    }

    tcg_target_init(s);
    process_op_defs(s);

    /* Reverse the order of the saved registers, assuming they're all at
       the start of tcg_target_reg_alloc_order.  */
    for (n = 0; n < ARRAY_SIZE(tcg_target_reg_alloc_order); ++n) {
        int r = tcg_target_reg_alloc_order[n];
        if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, r)) {
            break;
        }
    }
    n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    s->indirect_reg_alloc_order = g_malloc(sizeof(int) * n);
    for (i = 0; i < n; ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[n - 1 - i];
    }
    for (; i < ARRAY_SIZE(tcg_target_reg_alloc_order); ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[i];
    }

    s->one_entry = g_malloc(sizeof(struct jit_code_entry));
    s->one_entry->symfile_addr = NULL;

    tcg_debug_assert(!tcg_regset_test_reg(s->reserved_regs, TCG_AREG0));
    ts = tcg_global_reg_new_internal(s, TCG_TYPE_PTR, TCG_AREG0, "env");
    s->cpu_env = temp_tcgv_ptr(s, ts);
}